

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O0

idx_t duckdb::DistinctSelectGenericLoop<float,float,duckdb::DistinctFrom,false,true,false>
                (float *ldata,float *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lmask,ValidityMask *rmask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  byte left_null;
  idx_t iVar2;
  SelectionVector *this;
  float *right;
  TemplatedValidityMask<unsigned_long> *this_00;
  SelectionVector *in_RCX;
  SelectionVector *in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  idx_t rindex;
  idx_t lindex;
  idx_t result_idx;
  idx_t i;
  idx_t false_count;
  idx_t true_count;
  undefined1 in_stack_ffffffffffffff8e;
  undefined8 local_48;
  undefined8 local_38;
  
  local_38 = 0;
  for (local_48 = 0; local_48 < in_R9; local_48 = local_48 + 1) {
    SelectionVector::get_index(in_R8,local_48);
    iVar2 = SelectionVector::get_index(in_RDX,local_48);
    this = (SelectionVector *)SelectionVector::get_index(in_RCX,local_48);
    right = (float *)(in_RDI + iVar2 * 4);
    this_00 = (TemplatedValidityMask<unsigned_long> *)(in_RSI + (long)this * 4);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,(idx_t)right);
    left_null = bVar1 ^ 0xff;
    TemplatedValidityMask<unsigned_long>::RowIsValid(this_00,(idx_t)right);
    bVar1 = DistinctFrom::Operation<float>
                      ((float *)this_00,right,(bool)left_null,(bool)in_stack_ffffffffffffff8e);
    if (bVar1) {
      local_38 = local_38 + 1;
      SelectionVector::set_index(this,(idx_t)this_00,(idx_t)right);
    }
  }
  return local_38;
}

Assistant:

static inline idx_t
DistinctSelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
                          const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
                          const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lmask,
                          ValidityMask &rmask, SelectionVector *true_sel, SelectionVector *false_sel) {
#ifdef DUCKDB_SMALLER_BINARY
	bool HAS_TRUE_SEL = true_sel;
	bool HAS_FALSE_SEL = false_sel;
#endif
	idx_t true_count = 0, false_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto result_idx = result_sel->get_index(i);
		auto lindex = lsel->get_index(i);
		auto rindex = rsel->get_index(i);
#ifndef DUCKDB_SMALLER_BINARY
		if (NO_NULL) {
			if (OP::Operation(ldata[lindex], rdata[rindex], false, false)) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		} else
#endif
		{
			if (OP::Operation(ldata[lindex], rdata[rindex], !lmask.RowIsValid(lindex), !rmask.RowIsValid(rindex))) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
	}
	if (HAS_TRUE_SEL) {
		return true_count;
	} else {
		return count - false_count;
	}
}